

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O3

void f_outer(uint64_t *h,uint8_t *blk,uint64_t offset_hi,uint64_t offset_lo,uint final)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint64_t uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint64_t m [16];
  ulong local_158;
  ulong local_150;
  ulong local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  uint64_t local_128;
  uint64_t uStack_120;
  uint64_t local_118;
  uint64_t uStack_110;
  uint64_t local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  long local_b8 [17];
  
  memcpy(local_b8,blk,0x80);
  local_138 = *h;
  uStack_130 = h[1];
  local_128 = h[2];
  uStack_120 = h[3];
  local_118 = h[4];
  uStack_110 = h[5];
  local_108 = h[6];
  uStack_100 = h[7];
  local_d8 = offset_lo ^ 0x510e527fade682d1;
  local_d0 = offset_hi ^ 0x9b05688c2b3e6c1f;
  local_c8 = -(ulong)final ^ 0x1f83d9abfb41bd6b;
  local_148 = 0xa54ff53a5f1d36f1;
  local_c0 = 0x5be0cd19137e2179;
  local_150 = 0x3c6ef372fe94f82b;
  local_f0 = 0xbb67ae8584caa73b;
  local_158 = 0x6a09e667f3bcc908;
  lVar18 = 0xf;
  do {
    uVar14 = local_138 + local_118 + local_b8[*(byte *)((long)iv + lVar18 + 0x31)];
    uVar23 = uStack_130 + uStack_110 + local_b8[*(byte *)((long)iv + lVar18 + 0x33)];
    local_d8 = local_d8 ^ uVar14;
    uVar13 = local_d8 << 0x20 | local_d8 >> 0x20;
    local_d0 = local_d0 ^ uVar23;
    uVar12 = local_d0 << 0x20 | local_d0 >> 0x20;
    local_158 = local_158 + uVar13;
    local_f0 = local_f0 + uVar12;
    uVar21 = local_128 + local_108 + local_b8[*(byte *)((long)iv + lVar18 + 0x35)];
    uVar19 = local_118 ^ local_158;
    uVar16 = uStack_110 ^ local_f0;
    local_c8 = local_c8 ^ uVar21;
    uVar20 = uVar19 << 0x28 | uVar19 >> 0x18;
    uVar19 = local_c8 << 0x20 | local_c8 >> 0x20;
    uVar17 = uVar16 << 0x28 | uVar16 >> 0x18;
    local_150 = local_150 + uVar19;
    uVar16 = local_108 ^ local_150;
    uVar15 = uVar16 << 0x28 | uVar16 >> 0x18;
    uVar14 = uVar14 + local_b8[*(byte *)((long)iv + lVar18 + 0x32)] + uVar20;
    uVar24 = uVar23 + local_b8[*(byte *)((long)iv + lVar18 + 0x34)] + uVar17;
    uVar22 = uVar21 + local_b8[*(byte *)((long)iv + lVar18 + 0x36)] + uVar15;
    uVar13 = uVar13 ^ uVar14;
    uVar21 = uStack_120 + uStack_100 + local_b8[*(byte *)((long)iv + lVar18 + 0x37)];
    uVar12 = uVar12 ^ uVar24;
    uVar19 = uVar19 ^ uVar22;
    local_c0 = local_c0 ^ uVar21;
    uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
    uVar23 = local_c0 << 0x20 | local_c0 >> 0x20;
    uVar12 = uVar12 << 0x30 | uVar12 >> 0x10;
    local_148 = local_148 + uVar23;
    uVar19 = uVar19 << 0x30 | uVar19 >> 0x10;
    uStack_100 = uStack_100 ^ local_148;
    uVar16 = uStack_100 << 0x28 | uStack_100 >> 0x18;
    local_158 = local_158 + uVar13;
    uVar21 = uVar21 + local_b8[*(byte *)((long)iv + lVar18 + 0x38)] + uVar16;
    local_f0 = local_f0 + uVar12;
    uVar23 = uVar23 ^ uVar21;
    uVar23 = uVar23 << 0x30 | uVar23 >> 0x10;
    local_150 = local_150 + uVar19;
    uVar20 = uVar20 ^ local_158;
    uVar17 = uVar17 ^ local_f0;
    uVar15 = uVar15 ^ local_150;
    uVar20 = uVar20 << 1 | (ulong)((long)uVar20 < 0);
    uVar17 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
    local_148 = local_148 + uVar23;
    uVar15 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
    uVar14 = uVar14 + local_b8[*(byte *)((long)iv + lVar18 + 0x39)] + uVar17;
    uVar23 = uVar23 ^ uVar14;
    uVar16 = uVar16 ^ local_148;
    uVar16 = uVar16 << 1 | (ulong)((long)uVar16 < 0);
    uVar24 = uVar24 + local_b8[*(byte *)((long)iv + lVar18 + 0x3b)] + uVar15;
    uVar13 = uVar13 ^ uVar24;
    uVar22 = uVar22 + local_b8[*(byte *)((long)iv + lVar18 + 0x3d)] + uVar16;
    uVar12 = uVar12 ^ uVar22;
    uVar21 = uVar21 + uVar20 + local_b8[*(byte *)((long)iv + lVar18 + 0x3f)];
    uVar19 = uVar19 ^ uVar21;
    uVar23 = uVar23 << 0x20 | uVar23 >> 0x20;
    local_150 = local_150 + uVar23;
    uVar17 = uVar17 ^ local_150;
    uVar17 = uVar17 << 0x28 | uVar17 >> 0x18;
    uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
    local_148 = local_148 + uVar13;
    local_138 = uVar14 + local_b8[*(byte *)((long)iv + lVar18 + 0x3a)] + uVar17;
    uVar15 = uVar15 ^ local_148;
    uVar15 = uVar15 << 0x28 | uVar15 >> 0x18;
    uVar23 = uVar23 ^ local_138;
    uStack_130 = uVar24 + local_b8[*(byte *)((long)iv + lVar18 + 0x3c)] + uVar15;
    uVar12 = uVar12 << 0x20 | uVar12 >> 0x20;
    uVar13 = uVar13 ^ uStack_130;
    local_158 = local_158 + uVar12;
    uVar16 = uVar16 ^ local_158;
    local_c0 = uVar23 << 0x30 | uVar23 >> 0x10;
    uVar14 = uVar16 << 0x28 | uVar16 >> 0x18;
    local_d8 = uVar13 << 0x30 | uVar13 >> 0x10;
    local_150 = local_150 + local_c0;
    local_128 = uVar22 + local_b8[*(byte *)((long)iv + lVar18 + 0x3e)] + uVar14;
    uVar12 = uVar12 ^ local_128;
    local_148 = local_148 + local_d8;
    local_d0 = uVar12 << 0x30 | uVar12 >> 0x10;
    local_158 = local_158 + local_d0;
    uVar17 = uVar17 ^ local_150;
    uVar12 = uVar19 << 0x20 | uVar19 >> 0x20;
    local_f0 = local_f0 + uVar12;
    uVar15 = uVar15 ^ local_148;
    uVar20 = uVar20 ^ local_f0;
    uVar13 = uVar20 << 0x28 | uVar20 >> 0x18;
    uVar14 = uVar14 ^ local_158;
    uStack_120 = uVar21 + local_b8[sigma[0][lVar18]] + uVar13;
    uVar12 = uVar12 ^ uStack_120;
    uStack_110 = uVar17 << 1 | (ulong)((long)uVar17 < 0);
    local_c8 = uVar12 << 0x30 | uVar12 >> 0x10;
    local_108 = uVar15 << 1 | (ulong)((long)uVar15 < 0);
    local_f0 = local_f0 + local_c8;
    uVar13 = uVar13 ^ local_f0;
    uStack_100 = uVar14 << 1 | (ulong)((long)uVar14 < 0);
    local_118 = uVar13 << 1 | (ulong)((long)uVar13 < 0);
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0xcf);
  local_f8 = local_158;
  local_e8 = local_150;
  local_e0 = local_148;
  lVar18 = 0;
  do {
    uVar3 = *(uint *)((long)&local_f8 + lVar18 * 8 + 4);
    uVar4 = *(uint *)(&local_f0 + lVar18);
    uVar5 = *(uint *)((long)&local_f0 + lVar18 * 8 + 4);
    uVar6 = *(uint *)((long)&local_138 + lVar18 * 8 + 4);
    uVar7 = *(uint *)(&uStack_130 + lVar18);
    uVar8 = *(uint *)((long)&uStack_130 + lVar18 * 8 + 4);
    puVar1 = h + lVar18;
    uVar9 = *(uint *)((long)puVar1 + 4);
    uVar11 = puVar1[1];
    uVar10 = *(uint *)((long)puVar1 + 0xc);
    puVar2 = h + lVar18;
    *(uint *)puVar2 = (uint)*puVar1 ^ *(uint *)(&local_f8 + lVar18) ^ *(uint *)(&local_138 + lVar18)
    ;
    *(uint *)((long)puVar2 + 4) = uVar9 ^ uVar3 ^ uVar6;
    *(uint *)(puVar2 + 1) = (uint)uVar11 ^ uVar4 ^ uVar7;
    *(uint *)((long)puVar2 + 0xc) = uVar10 ^ uVar5 ^ uVar8;
    lVar18 = lVar18 + 2;
  } while (lVar18 != 8);
  smemclr(&local_138,0x80);
  smemclr(local_b8,0x80);
  return;
}

Assistant:

static inline void f_outer(uint64_t h[8], uint8_t blk[128], uint64_t offset_hi,
                           uint64_t offset_lo, unsigned final)
{
    uint64_t m[16];
    for (unsigned i = 0; i < 16; i++)
        m[i] = GET_64BIT_LSB_FIRST(blk + 8*i);
    f(h, m, offset_hi, offset_lo, final);
    smemclr(m, sizeof(m));
}